

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O2

state parse_url_char(state s,char ch)

{
  state sVar1;
  state sVar2;
  int iVar3;
  undefined7 in_register_00000031;
  
  if (((uint)CONCAT71(in_register_00000031,ch) < 0x21) &&
     ((0x100003600U >> ((ulong)(byte)ch & 0x3f) & 1) != 0)) {
    return s_dead;
  }
  if (0xb < s - s_req_spaces_before_url) {
    return s_dead;
  }
  iVar3 = (int)ch;
  switch(s) {
  case s_req_spaces_before_url:
    if (iVar3 == 0x2a) {
      return s_req_path;
    }
    if (iVar3 == 0x2f) {
      return s_req_path;
    }
    if (0x19 < (byte)((ch | 0x20U) + 0x9f)) {
      return s_dead;
    }
    goto LAB_0015ce8a;
  case s_req_schema:
    if (0x19 < (byte)((ch | 0x20U) + 0x9f)) {
      if (ch != ':') {
        return s_dead;
      }
      return s_req_schema_slash;
    }
LAB_0015ce8a:
    sVar1 = s_req_schema;
    break;
  case s_req_schema_slash:
    if (ch != '/') {
      return s_dead;
    }
    sVar1 = s_req_schema_slash_slash;
    break;
  case s_req_schema_slash_slash:
    if (ch != '/') {
      return s_dead;
    }
    sVar1 = s_req_server_start;
    break;
  default:
    if (iVar3 == 0x40) {
      return s_req_server_with_at;
    }
    if (iVar3 == 0x3f) {
      return s_req_query_string_start;
    }
    if (iVar3 != 0x2f) {
LAB_0015cd22:
      if ((((9 < (byte)(ch - 0x30U)) && (0x19 < (byte)((ch | 0x20U) + 0x9f))) &&
          ((0x3e < iVar3 - 0x21U ||
           ((0x5400000016003ff9U >> ((ulong)(iVar3 - 0x21U) & 0x3f) & 1) == 0)))) && (iVar3 != 0x7e)
         ) {
        return s_dead;
      }
      return s_req_server;
    }
    goto LAB_0015ce0a;
  case s_req_server_with_at:
    if (iVar3 != 0x2f) {
      if (iVar3 == 0x3f) {
        return s_req_query_string_start;
      }
      if (iVar3 == 0x40) {
        return s_dead;
      }
      goto LAB_0015cd22;
    }
    goto LAB_0015ce0a;
  case s_req_path:
    if ((""[(byte)ch >> 3] >> ((byte)ch & 7) & 1) == 0) {
      sVar1 = s_dead;
      if (ch == '#') {
        sVar1 = s_req_fragment_start;
      }
      sVar2 = s_req_query_string_start;
LAB_0015ce73:
      if (ch != '?') {
        sVar2 = sVar1;
      }
      return sVar2;
    }
LAB_0015ce0a:
    sVar1 = s_req_path;
    break;
  case s_req_query_string_start:
  case s_req_query_string:
    if ((""[(byte)ch >> 3] >> ((byte)ch & 7) & 1) == 0) {
      sVar1 = s_dead;
      if (ch == '#') {
        sVar1 = s_req_fragment_start;
      }
      sVar2 = s_req_query_string;
      goto LAB_0015ce73;
    }
    sVar1 = s_req_query_string;
    break;
  case s_req_fragment_start:
    if ((""[(byte)ch >> 3] >> ((byte)ch & 7) & 1) == 0) {
      sVar1 = s_dead;
      if (ch == '#') {
        sVar1 = s_req_fragment_start;
      }
      sVar2 = s_req_fragment;
      goto LAB_0015ce73;
    }
    goto LAB_0015ce2a;
  case s_req_fragment:
    if ((""[(byte)ch >> 3] >> ((byte)ch & 7) & 1) == 0) {
      sVar1 = s_dead;
      if (ch == '#') {
        sVar1 = s_req_fragment;
      }
      if (ch == '?') {
        sVar1 = s_req_fragment;
      }
      return sVar1;
    }
LAB_0015ce2a:
    sVar1 = s_req_fragment;
  }
  return sVar1;
}

Assistant:

static enum state
parse_url_char(enum state s, const char ch)
{
  if (ch == ' ' || ch == '\r' || ch == '\n') {
    return s_dead;
  }

#if HTTP_PARSER_STRICT
  if (ch == '\t' || ch == '\f') {
    return s_dead;
  }
#endif

  switch (s) {
    case s_req_spaces_before_url:
      /* Proxied requests are followed by scheme of an absolute URI (alpha).
       * All methods except CONNECT are followed by '/' or '*'.
       */

      if (ch == '/' || ch == '*') {
        return s_req_path;
      }

      if (IS_ALPHA(ch)) {
        return s_req_schema;
      }

      break;

    case s_req_schema:
      if (IS_ALPHA(ch)) {
        return s;
      }

      if (ch == ':') {
        return s_req_schema_slash;
      }

      break;

    case s_req_schema_slash:
      if (ch == '/') {
        return s_req_schema_slash_slash;
      }

      break;

    case s_req_schema_slash_slash:
      if (ch == '/') {
        return s_req_server_start;
      }

      break;

    case s_req_server_with_at:
      if (ch == '@') {
        return s_dead;
      }

    /* fall through */
    case s_req_server_start:
    case s_req_server:
      if (ch == '/') {
        return s_req_path;
      }

      if (ch == '?') {
        return s_req_query_string_start;
      }

      if (ch == '@') {
        return s_req_server_with_at;
      }

      if (IS_USERINFO_CHAR(ch) || ch == '[' || ch == ']') {
        return s_req_server;
      }

      break;

    case s_req_path:
      if (IS_URL_CHAR(ch)) {
        return s;
      }

      switch (ch) {
        case '?':
          return s_req_query_string_start;

        case '#':
          return s_req_fragment_start;
      }

      break;

    case s_req_query_string_start:
    case s_req_query_string:
      if (IS_URL_CHAR(ch)) {
        return s_req_query_string;
      }

      switch (ch) {
        case '?':
          /* allow extra '?' in query string */
          return s_req_query_string;

        case '#':
          return s_req_fragment_start;
      }

      break;

    case s_req_fragment_start:
      if (IS_URL_CHAR(ch)) {
        return s_req_fragment;
      }

      switch (ch) {
        case '?':
          return s_req_fragment;

        case '#':
          return s;
      }

      break;

    case s_req_fragment:
      if (IS_URL_CHAR(ch)) {
        return s;
      }

      switch (ch) {
        case '?':
        case '#':
          return s;
      }

      break;

    default:
      break;
  }

  /* We should never fall out of the switch above unless there's an error */
  return s_dead;
}